

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonConvert.h
# Opt level: O0

void __thiscall
Json::JsonConvert::JsonConvert(JsonConvert *this,FILE *fp,bool format,int indent,bool escape)

{
  JsonParser local_90;
  byte local_21;
  int local_20;
  bool escape_local;
  int indent_local;
  bool format_local;
  FILE *fp_local;
  JsonConvert *this_local;
  
  local_21 = escape;
  local_20 = indent;
  escape_local = format;
  _indent_local = fp;
  fp_local = (FILE *)this;
  JsonParser::JsonParser(&local_90,fp);
  JsonConvert(this,&local_90,(bool)(escape_local & 1),local_20,(bool)(local_21 & 1));
  JsonParser::~JsonParser(&local_90);
  return;
}

Assistant:

explicit JsonConvert(FILE *fp, bool format = false, int indent = 4, bool escape = false)
                : JsonConvert(JsonParser(fp), format, indent, escape) {}